

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc_length_parameterized_bezier.cpp
# Opt level: O3

int main(void)

{
  double dVar1;
  double dVar2;
  void *pvVar3;
  Matrix<double,_2,_1,_0,_2,_1> *p;
  Matrix<double,_2,_1,_0,_2,_1> *pMVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  PointType PVar9;
  PointType ps4;
  double t;
  PointType ps4_1;
  double step;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> vec;
  Mat img;
  Bezier<3,_2> bezier;
  _InputArray local_280;
  initializer_list<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_268;
  Matrix<double,_2,_1,_0,_2,_1> local_258;
  double local_240;
  _InputArray local_238;
  double local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  void *local_1f8;
  undefined8 uStack_1f0;
  long local_1e8;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  int local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  Matrix<double,_2,_1,_0,_2,_1> local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  Bezier<3,_2> local_158;
  
  local_268._M_array = &local_1b8;
  local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       100.0;
  local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       200.0;
  local_1a8 = 0x4079000000000000;
  uStack_1a0 = 0x4059000000000000;
  local_198 = 0x4074000000000000;
  uStack_190 = 0x4072c00000000000;
  local_188 = 0x4082c00000000000;
  uStack_180 = 0x4079000000000000;
  local_268._M_len = 4;
  Bezier<3,_2>::Bezier(&local_158,&local_268);
  local_258.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_258.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_268._M_array = (iterator)0x0;
  local_268._M_len = 0;
  cv::Mat::Mat((Mat *)&local_1b8,500,700,0x10,(Scalar_ *)&local_268);
  local_238.obj = &local_1f8;
  local_1e8 = 0;
  local_1f8 = (void *)0x0;
  uStack_1f0 = 0;
  local_240 = 0.0;
  local_220 = 0.01;
  do {
    local_280.flags = 0;
    local_238.flags = 4;
    Curve<3,_2>::atWithArcLengthParameterized
              ((Curve<3,_2> *)&local_268,(double *)&local_158,(int *)&local_240,&local_280.flags,
               (double *)&local_238);
    local_280.flags = (int)(double)local_268._M_array;
    local_238.flags = (int)(double)local_268._M_len;
    std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<int,int>
              ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)local_238.obj,
               &local_280.flags,&local_238.flags);
    local_240 = local_240 + 0.01;
  } while (local_240 <= 1.0);
  local_280.sz.width = 0;
  local_280.sz.height = 0;
  local_280.flags = 0x3010000;
  local_280.obj = &local_1b8;
  local_238.sz.width = 0;
  local_238.sz.height = 0;
  local_238.flags = -0x7efcfff4;
  local_268._M_array = (iterator)0x0;
  local_268._M_len = 0;
  local_258.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       255.0;
  local_258.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       0.0;
  cv::polylines((_InputOutputArray *)&local_280,&local_238,false,(Scalar_ *)&local_268,1,0x10,0);
  local_240 = 0.0;
  local_220 = 0.25;
  local_1d8 = 0;
  uStack_1d4 = 0;
  uStack_1d0 = 0;
  uStack_1cc = 0x406fe000;
  iVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  do {
    local_268._M_array = (iterator)((ulong)local_268._M_array & 0xffffffff00000000);
    local_280.flags = 4;
    local_1c8 = iVar5;
    uStack_1c4 = uVar6;
    uStack_1c0 = uVar7;
    uStack_1bc = uVar8;
    PVar9 = Curve<3,_2>::atWithArcLengthParameterized
                      ((Curve<3,_2> *)&local_238,(double *)&local_158,(int *)&local_240,
                       (int *)&local_268,(double *)&local_280);
    local_280.sz.width = 0;
    local_280.sz.height = 0;
    local_280.flags = 0x3010000;
    local_280.obj = &local_1b8;
    local_200 = CONCAT44((int)(double)local_238.obj,
                         (int)(double)CONCAT44(local_238._4_4_,local_238.flags));
    local_268._M_array = (iterator)CONCAT44(uStack_1d4,local_1d8);
    local_268._M_len = CONCAT44(uStack_1cc,uStack_1d0);
    local_258.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
         = 0.0;
    local_258.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
         = 0.0;
    cv::circle(0,PVar9.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
                 .array[1],&local_280,&local_200,4,&local_268,0xffffffff,8,0);
    dVar1 = (double)CONCAT44(uStack_1c4,local_1c8);
    dVar2 = (double)CONCAT44(uStack_1bc,uStack_1c0);
    if ((((dVar1 != 0.0) || (NAN(dVar1))) || (dVar2 != 0.0)) || (NAN(dVar2))) {
      local_280.sz.width = 0;
      local_280.sz.height = 0;
      local_280.flags = 0x3010000;
      local_208 = CONCAT44((int)dVar2,(int)dVar1);
      local_280.obj = &local_1b8;
      local_210 = CONCAT44((int)(double)local_238.obj,
                           (int)(double)CONCAT44(local_238._4_4_,local_238.flags));
      local_268._M_array = (iterator)0x406fe00000000000;
      local_268._M_len = 0x406fe00000000000;
      local_258.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [0] = 255.0;
      local_258.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [1] = 0.0;
      cv::line(&local_280,&local_208,&local_210,&local_268,1,0x10,0);
    }
    local_240 = local_240 + 0.25;
    iVar5 = local_238.flags;
    uVar6 = local_238._4_4_;
    uVar7 = local_238.obj._0_4_;
    uVar8 = local_238.obj._4_4_;
  } while (local_240 <= 1.0);
  local_268._M_array = (iterator)CONCAT44(local_268._M_array._4_4_,4);
  Curve<3,_2>::sampleWithArcLengthParameterized
            ((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&local_280,&local_158.super_Curve<3,_2>,&local_220,false,(int *)&local_268,
             (vector<double,_std::allocator<double>_> *)0x0);
  pvVar3 = local_280.obj;
  pMVar4 = (Matrix<double,_2,_1,_0,_2,_1> *)CONCAT44(local_280._4_4_,local_280.flags);
  if (pMVar4 != (Matrix<double,_2,_1,_0,_2,_1> *)local_280.obj) {
    do {
      local_238.sz.width = 0;
      local_238.sz.height = 0;
      local_238.flags = 0x3010000;
      local_238.obj = &local_1b8;
      local_218 = CONCAT44((int)(pMVar4->
                                super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                                m_storage.m_data.array[1],
                           (int)(pMVar4->
                                super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                                m_storage.m_data.array[0]);
      local_268._M_array = (iterator)0x406fe00000000000;
      local_258.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [1] = 0.0;
      local_268._M_len = 0;
      local_258.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [0] = 0.0;
      cv::circle(&local_238,&local_218,2,&local_268,0xffffffff,8,0);
      pMVar4 = pMVar4 + 1;
    } while (pMVar4 != (Matrix<double,_2,_1,_0,_2,_1> *)pvVar3);
    pMVar4 = (Matrix<double,_2,_1,_0,_2,_1> *)CONCAT44(local_280._4_4_,local_280.flags);
  }
  if (pMVar4 != (Matrix<double,_2,_1,_0,_2,_1> *)0x0) {
    operator_delete(pMVar4,(long)local_280.sz - (long)pMVar4);
  }
  local_268._M_array = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"arc-length parameterized of bezier curve","");
  local_280.sz.width = 0;
  local_280.sz.height = 0;
  local_280.flags = 0x1010000;
  local_280.obj = &local_1b8;
  cv::imshow((string *)&local_268,&local_280);
  if (local_268._M_array != &local_258) {
    operator_delete(local_268._M_array,
                    (long)local_258.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                          m_storage.m_data.array[0] + 1);
  }
  cv::waitKey(0);
  if (local_1f8 != (void *)0x0) {
    operator_delete(local_1f8,local_1e8 - (long)local_1f8);
  }
  cv::Mat::~Mat((Mat *)&local_1b8);
  return 0;
}

Assistant:

int main() {
  // define a bezier
  Bezier bezier{{100, 200}, {400, 100}, {320, 300}, {600, 400}};

  Mat img(500, 700, CV_8UC3, Scalar(0));

  Eigen::Vector2d prev_point{0, 0};
  vector<Point> vec;

  // draw curve
  double t = 0.0, step = 0.01;
  while (t <= 1.0) {
    auto ps4 = bezier.atWithArcLengthParameterized(t, 0, 4);
    vec.emplace_back(int(ps4[0]), int(ps4[1]));
    t += step;
  }
  polylines(img, vec, false, {0, 0, 255}, 1, LINE_AA);

  // draw equal arc distance point
  t = 0, step = 0.25;
  while (t <= 1.0) {
    auto ps4 = bezier.atWithArcLengthParameterized(t, 0, 4);
    circle(img, {int(ps4[0]), int(ps4[1])}, 4, {0, 255, 0}, -1);
    if (prev_point != Eigen::Vector2d::Zero()) {
      line(img,
           {int(prev_point[0]), int(prev_point[1])},
           {int(ps4[0]), int(ps4[1])},
           {255, 255, 255},
           1,
           LINE_AA);
    }
    prev_point = ps4;
    t += step;
  }

  for (auto& p : bezier.sampleWithArcLengthParameterized(step, false, 4)) {
    circle(img, {int(p[0]), int(p[1])}, 2, {255, 0, 0}, -1);
  }

  imshow("arc-length parameterized of bezier curve", img);
  waitKey(0);

  return 0;
}